

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall cbtCollisionWorld::debugDrawWorld(cbtCollisionWorld *this)

{
  cbtCollisionObject *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar6;
  uint uVar7;
  long lVar8;
  cbtVector3 minAabb;
  cbtVector3 maxAabb;
  cbtVector3 maxAabb2;
  cbtVector3 minAabb2;
  cbtVector3 colorvec;
  DefaultColors defaultColors;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  ulong local_e8;
  uint local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40 [16];
  
  iVar3 = (*this->_vptr_cbtCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 200))
              ((long *)CONCAT44(extraout_var_00,iVar3));
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))(local_a0);
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x70))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    if ((((uVar5 & 8) != 0) && (this->m_dispatcher1 != (cbtDispatcher *)0x0)) &&
       (local_dc = (*this->m_dispatcher1->_vptr_cbtDispatcher[9])(), 0 < (int)local_dc)) {
      uVar5 = 0;
      do {
        local_e8 = uVar5;
        iVar3 = (*this->m_dispatcher1->_vptr_cbtDispatcher[10])();
        lVar6 = CONCAT44(extraout_var_03,iVar3);
        iVar3 = *(int *)(lVar6 + 0x398);
        if (0 < (long)iVar3) {
          lVar8 = 0;
          do {
            iVar4 = (*this->_vptr_cbtCollisionWorld[5])(this);
            (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x50))
                      (*(undefined4 *)(lVar6 + 0x70 + lVar8),(long *)CONCAT44(extraout_var_04,iVar4)
                       ,lVar6 + 0x40 + lVar8,lVar6 + 0x60 + lVar8,
                       *(undefined4 *)(lVar6 + 0xc4 + lVar8),local_40);
            lVar8 = lVar8 + 0xe0;
          } while ((long)iVar3 * 0xe0 - lVar8 != 0);
        }
        uVar7 = (int)local_e8 + 1;
        uVar5 = (ulong)uVar7;
      } while (uVar7 != local_dc);
    }
    iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x70))
                      ((long *)CONCAT44(extraout_var_05,iVar3));
    if (((uVar5 & 3) != 0) && (0 < (this->m_collisionObjects).m_size)) {
      lVar6 = 0;
      do {
        pcVar1 = (this->m_collisionObjects).m_data[lVar6];
        if ((pcVar1->m_collisionFlags & 0x20) == 0) {
          iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
          if (CONCAT44(extraout_var_06,iVar3) != 0) {
            iVar3 = (*this->_vptr_cbtCollisionWorld[5])(this);
            uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x70))
                              ((long *)CONCAT44(extraout_var_07,iVar3));
            if ((uVar5 & 1) != 0) {
              switch(pcVar1->m_activationState1) {
              case 1:
                _local_108 = local_a0;
                break;
              case 2:
                _local_108 = local_90;
                break;
              case 3:
                _local_108 = local_80;
                break;
              case 4:
                _local_108 = local_70;
                break;
              case 5:
                _local_108 = local_60;
                break;
              default:
                _local_108 = _DAT_00a140f0;
              }
              if ((pcVar1->m_collisionFlags & 0x100) != 0) {
                _local_108 = *(undefined1 (*) [16])(pcVar1->m_customDebugColorRGB).m_floats;
              }
              (*this->_vptr_cbtCollisionWorld[7])
                        (this,&pcVar1->m_worldTransform,pcVar1->m_collisionShape,local_108);
            }
          }
          if ((this->m_debugDrawer != (cbtIDebugDraw *)0x0) &&
             (uVar7 = (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xe])(), (uVar7 & 2) != 0)) {
            local_b8 = local_50;
            uStack_b0 = uStack_48;
            (*pcVar1->m_collisionShape->_vptr_cbtCollisionShape[2])
                      (pcVar1->m_collisionShape,&pcVar1->m_worldTransform,local_108,&local_f8);
            auVar2 = _local_108;
            local_108._4_4_ = (float)local_108._4_4_ - gContactBreakingThreshold;
            local_108._0_4_ = (float)local_108._0_4_ - gContactBreakingThreshold;
            fStack_100 = auVar2._8_4_;
            fStack_fc = auVar2._12_4_;
            fStack_100 = fStack_100 - gContactBreakingThreshold;
            local_f8 = gContactBreakingThreshold + local_f8;
            local_f4 = gContactBreakingThreshold + local_f4;
            local_f0 = gContactBreakingThreshold + local_f0;
            if (((this->m_dispatchInfo).m_useContinuous == true) &&
               ((pcVar1->m_internalType == 2 && ((pcVar1->m_collisionFlags & 3) == 0)))) {
              local_e8 = CONCAT44(local_e8._4_4_,gContactBreakingThreshold);
              (*pcVar1->m_collisionShape->_vptr_cbtCollisionShape[2])
                        (pcVar1->m_collisionShape,&pcVar1->m_interpolationWorldTransform,&local_c8,
                         &local_d8);
              local_c8 = local_c8 - (float)local_e8;
              local_c4 = local_c4 - (float)local_e8;
              local_c0 = local_c0 - (float)local_e8;
              local_d8 = (float)local_e8 + local_d8;
              local_d4 = (float)local_e8 + local_d4;
              local_d0 = (float)local_e8 + local_d0;
              if (local_c8 < (float)local_108._0_4_) {
                local_108._0_4_ = local_c8;
              }
              if (local_c4 < (float)local_108._4_4_) {
                local_108._4_4_ = local_c4;
              }
              if (local_c0 < fStack_100) {
                fStack_100 = local_c0;
              }
              if (local_bc < fStack_fc) {
                fStack_fc = local_bc;
              }
              if (local_f8 < local_d8) {
                local_f8 = local_d8;
              }
              if (local_f4 < local_d4) {
                local_f4 = local_d4;
              }
              if (local_f0 < local_d0) {
                local_f0 = local_d0;
              }
              if (local_ec < local_cc) {
                local_ec = local_cc;
              }
            }
            (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xf])
                      (this->m_debugDrawer,local_108,&local_f8,&local_b8);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->m_collisionObjects).m_size);
    }
  }
  return;
}

Assistant:

void cbtCollisionWorld::debugDrawWorld()
{
	if (getDebugDrawer())
	{
		getDebugDrawer()->clearLines();

		cbtIDebugDraw::DefaultColors defaultColors = getDebugDrawer()->getDefaultColors();

		if (getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawContactPoints)
		{
			if (getDispatcher())
			{
				int numManifolds = getDispatcher()->getNumManifolds();

				for (int i = 0; i < numManifolds; i++)
				{
					cbtPersistentManifold* contactManifold = getDispatcher()->getManifoldByIndexInternal(i);
					//cbtCollisionObject* obA = static_cast<cbtCollisionObject*>(contactManifold->getBody0());
					//cbtCollisionObject* obB = static_cast<cbtCollisionObject*>(contactManifold->getBody1());

					int numContacts = contactManifold->getNumContacts();
					for (int j = 0; j < numContacts; j++)
					{
						cbtManifoldPoint& cp = contactManifold->getContactPoint(j);
						getDebugDrawer()->drawContactPoint(cp.m_positionWorldOnB, cp.m_normalWorldOnB, cp.getDistance(), cp.getLifeTime(), defaultColors.m_contactPoint);
					}
				}
			}
		}

		if ((getDebugDrawer()->getDebugMode() & (cbtIDebugDraw::DBG_DrawWireframe | cbtIDebugDraw::DBG_DrawAabb)))
		{
			int i;

			for (i = 0; i < m_collisionObjects.size(); i++)
			{
				cbtCollisionObject* colObj = m_collisionObjects[i];
				if ((colObj->getCollisionFlags() & cbtCollisionObject::CF_DISABLE_VISUALIZE_OBJECT) == 0)
				{
					if (getDebugDrawer() && (getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawWireframe))
					{
						cbtVector3 color(cbtScalar(0.4), cbtScalar(0.4), cbtScalar(0.4));

						switch (colObj->getActivationState())
						{
							case ACTIVE_TAG:
								color = defaultColors.m_activeObject;
								break;
							case ISLAND_SLEEPING:
								color = defaultColors.m_deactivatedObject;
								break;
							case WANTS_DEACTIVATION:
								color = defaultColors.m_wantsDeactivationObject;
								break;
							case DISABLE_DEACTIVATION:
								color = defaultColors.m_disabledDeactivationObject;
								break;
							case DISABLE_SIMULATION:
								color = defaultColors.m_disabledSimulationObject;
								break;
							default:
							{
								color = cbtVector3(cbtScalar(.3), cbtScalar(0.3), cbtScalar(0.3));
							}
						};

						colObj->getCustomDebugColor(color);

						debugDrawObject(colObj->getWorldTransform(), colObj->getCollisionShape(), color);
					}
					if (m_debugDrawer && (m_debugDrawer->getDebugMode() & cbtIDebugDraw::DBG_DrawAabb))
					{
						cbtVector3 minAabb, maxAabb;
						cbtVector3 colorvec = defaultColors.m_aabb;
						colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), minAabb, maxAabb);
						cbtVector3 contactThreshold(gContactBreakingThreshold, gContactBreakingThreshold, gContactBreakingThreshold);
						minAabb -= contactThreshold;
						maxAabb += contactThreshold;

						cbtVector3 minAabb2, maxAabb2;

						if (getDispatchInfo().m_useContinuous && colObj->getInternalType() == cbtCollisionObject::CO_RIGID_BODY && !colObj->isStaticOrKinematicObject())
						{
							colObj->getCollisionShape()->getAabb(colObj->getInterpolationWorldTransform(), minAabb2, maxAabb2);
							minAabb2 -= contactThreshold;
							maxAabb2 += contactThreshold;
							minAabb.setMin(minAabb2);
							maxAabb.setMax(maxAabb2);
						}

						m_debugDrawer->drawAabb(minAabb, maxAabb, colorvec);
					}
				}
			}
		}
	}
}